

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

transformations_t *
opengv::absolute_pose::p3p_kneip
          (AbsoluteAdapterBase *adapter,size_t index0,size_t index1,size_t index2)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RDI;
  undefined8 in_R8;
  points_t p;
  bearingVectors_t f;
  transformations_t *solutions;
  transformations_t *in_stack_00000898;
  points_t *in_stack_000008a0;
  bearingVectors_t *in_stack_000008a8;
  value_type *in_stack_fffffffffffffee8;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *this;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 uVar1;
  undefined1 local_f8 [24];
  undefined1 local_e0 [24];
  undefined1 local_c8 [48];
  undefined1 local_98 [24];
  undefined1 local_80 [40];
  undefined1 local_58 [48];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  long *local_10;
  
  this = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0x7137a9);
  (**(code **)(*local_10 + 0x10))(local_58,local_10,local_18);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::push_back(this,in_stack_fffffffffffffee8);
  (**(code **)(*local_10 + 0x10))(local_80,local_10,local_20);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::push_back(this,in_stack_fffffffffffffee8);
  (**(code **)(*local_10 + 0x10))(local_98,local_10,local_28);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::push_back(this,in_stack_fffffffffffffee8);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0x713861);
  (**(code **)(*local_10 + 0x30))(local_c8,local_10,local_18);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::push_back(this,in_stack_fffffffffffffee8);
  (**(code **)(*local_10 + 0x30))(local_e0,local_10,local_20);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::push_back(this,in_stack_fffffffffffffee8);
  (**(code **)(*local_10 + 0x30))(local_f8,local_10,local_28);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::push_back(this,in_stack_fffffffffffffee8);
  std::
  vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
            *)0x713905);
  modules::p3p_kneip_main(in_stack_000008a8,in_stack_000008a0,in_stack_00000898);
  uVar1 = 1;
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)CONCAT17(1,in_stack_ffffffffffffff00));
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)CONCAT17(uVar1,in_stack_ffffffffffffff00));
  return (transformations_t *)in_RDI;
}

Assistant:

opengv::transformations_t
opengv::absolute_pose::p3p_kneip(
    const AbsoluteAdapterBase & adapter,
    size_t index0,
    size_t index1,
    size_t index2)
{
  bearingVectors_t f;
  f.push_back(adapter.getBearingVector(index0));
  f.push_back(adapter.getBearingVector(index1));
  f.push_back(adapter.getBearingVector(index2));
  points_t p;
  p.push_back(adapter.getPoint(index0));
  p.push_back(adapter.getPoint(index1));
  p.push_back(adapter.getPoint(index2));
  transformations_t solutions;
  modules::p3p_kneip_main( f, p, solutions );
  return solutions;
}